

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd.cpp
# Opt level: O3

void __thiscall
bp_osd::bp_osd(bp_osd *this,mod2sparse *H,double channel_prob,int max_iter,double osd_order,
              int osd_method,int bp_method)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  double *__s;
  int *piVar5;
  char **ppcVar6;
  unsigned_long_long uVar7;
  ostream *poVar8;
  int j;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  
  this->H = H;
  iVar3 = H->n_cols;
  this->M = H->n_rows;
  this->N = iVar3;
  iVar2 = mod2sparse_rank(H);
  this->rank = iVar2;
  iVar3 = this->N;
  uVar11 = (ulong)iVar3;
  this->K = iVar3 - iVar2;
  this->channel_prob = channel_prob;
  if ((max_iter == 0) || (iVar3 < max_iter)) {
    this->max_iter = iVar3;
  }
  else {
    this->max_iter = max_iter;
  }
  this->bp_method = bp_method;
  iVar2 = (int)osd_order;
  this->osd_order = iVar2;
  this->osd_method = osd_method;
  pcVar4 = (char *)operator_new__(uVar11);
  memset(pcVar4,0,uVar11);
  this->bp_decoding = pcVar4;
  pcVar4 = (char *)operator_new__(uVar11);
  memset(pcVar4,0,uVar11);
  this->osd0_decoding = pcVar4;
  pcVar4 = (char *)operator_new__(uVar11);
  memset(pcVar4,0,uVar11);
  this->osdw_decoding = pcVar4;
  uVar10 = 0xffffffffffffffff;
  if (-1 < iVar3) {
    uVar10 = uVar11 << 3;
  }
  __s = (double *)operator_new__(uVar10);
  memset(__s,0,uVar10);
  this->log_prob_ratios = __s;
  piVar5 = (int *)operator_new__(4);
  *piVar5 = 0;
  this->converge = piVar5;
  piVar5 = (int *)operator_new__(4);
  *piVar5 = 0;
  this->iter = piVar5;
  switch(osd_method) {
  case 0:
    dVar12 = exp2(osd_order);
    uVar11 = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
    this->encoding_input_count = uVar11;
    ppcVar6 = (char **)operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar11 * 8);
    this->osd_w_encoding_inputs = ppcVar6;
    if (uVar11 != 0) {
      uVar11 = 0;
      do {
        pcVar4 = decimal_to_binary_reverse((int)uVar11,this->N - this->rank);
        this->osd_w_encoding_inputs[uVar11] = pcVar4;
        uVar11 = uVar11 + 1;
      } while (uVar11 < this->encoding_input_count);
    }
    break;
  case 1:
    uVar7 = ncr(iVar2,2);
    uVar1 = this->K;
    uVar10 = (ulong)uVar1;
    iVar3 = (int)uVar7 + uVar1;
    this->encoding_input_count = (long)iVar3;
    uVar11 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar11 = (long)iVar3 * 8;
    }
    ppcVar6 = (char **)operator_new__(uVar11);
    this->osd_w_encoding_inputs = ppcVar6;
    uVar11 = 0;
    if (0 < (int)uVar1) {
      do {
        pcVar4 = (char *)operator_new__((long)(int)uVar10);
        memset(pcVar4,0,(long)(int)uVar10);
        this->osd_w_encoding_inputs[uVar11] = pcVar4;
        this->osd_w_encoding_inputs[uVar11][uVar11] = '\x01';
        uVar11 = uVar11 + 1;
        uVar10 = (ulong)this->K;
      } while ((long)uVar11 < (long)uVar10);
    }
    if (0.0 < osd_order) {
      uVar10 = 0;
      do {
        uVar9 = 0;
        do {
          if (uVar10 < uVar9) {
            iVar3 = this->K;
            pcVar4 = (char *)operator_new__((long)iVar3);
            memset(pcVar4,0,(long)iVar3);
            iVar3 = (int)uVar11;
            this->osd_w_encoding_inputs[iVar3] = pcVar4;
            this->osd_w_encoding_inputs[iVar3][uVar10] = '\x01';
            this->osd_w_encoding_inputs[iVar3][uVar9] = '\x01';
            uVar11 = (ulong)(iVar3 + 1);
          }
          uVar9 = uVar9 + 1;
        } while ((double)(int)uVar9 < osd_order);
        uVar10 = uVar10 + 1;
      } while ((double)(int)uVar10 < osd_order);
    }
    break;
  case 2:
    break;
  case 3:
    uVar7 = ncr(iVar2,2);
    this->encoding_input_count = (long)(int)uVar7 + (long)this->K;
    break;
  default:
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "ERROR. Function <bp_osd::constructor>. OSD Method ");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,osd_method);
    poVar8 = std::operator<<(poVar8," not valid");
    std::endl<char,std::char_traits<char>>(poVar8);
    exit(0x16);
  }
  return;
}

Assistant:

bp_osd::bp_osd(mod2sparse *H, double channel_prob, int max_iter, double osd_order,int osd_method, int bp_method){

    this->H=H;
    this->N=mod2sparse_cols(H);
    this->M=mod2sparse_rows(H);

    this->rank=mod2sparse_rank(H);
    this->K=N-rank;

    this->channel_prob=channel_prob;

    if(max_iter==0){this->max_iter=N;}
    else if(max_iter>N){this->max_iter=N;}
    else{this->max_iter=max_iter;}

    this->bp_method=bp_method;

    this->osd_order=osd_order;
    this->osd_method=osd_method;
    this->bp_decoding=new char[N]();
    this->osd0_decoding=new char[N]();
    this->osdw_decoding=new char[N]();
    this->log_prob_ratios=new double[N]();
    this->converge=new int[1]();
    this->iter=new int[1]();

    if(osd_method==0) {
        assert(osd_order<=N-rank);
        this->encoding_input_count=pow(2,osd_order);
        this->osd_w_encoding_inputs = new char*[encoding_input_count];
        for(int i = 0; i < encoding_input_count; ++i)
            osd_w_encoding_inputs[i] = decimal_to_binary_reverse(i, N - rank);
        }
    else if(osd_method==1){
        assert(osd_order<=K);
        int total_count=0;
        int w2_count=ncr(osd_order,2);
        this->encoding_input_count = K+w2_count;

        this->osd_w_encoding_inputs = new char*[encoding_input_count];
        for(int i=0;i<K;i++){
            osd_w_encoding_inputs[total_count]=new char[K]();
            osd_w_encoding_inputs[total_count][i]=1;
            total_count++;
        }
        for(int i=0;i<osd_order;i++){
            for(int j=0;j<osd_order;j++){
                if(i<j){
                    osd_w_encoding_inputs[total_count]=new char[K]();
                    osd_w_encoding_inputs[total_count][i]=1;
                    osd_w_encoding_inputs[total_count][j]=1;
                    total_count++;
                }
            }
        }
        assert(total_count==this->encoding_input_count);

    }
    else if(osd_method==2) 1;
    else if(osd_method==3){
        assert(osd_order<=K);
        int w2_count=ncr(osd_order,2);
        this->encoding_input_count = K+w2_count;
    }

    else{
        cout<<"ERROR. Function <bp_osd::constructor>. OSD Method "<<osd_method<< " not valid"<<endl;
        exit(22);
    }

}